

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml.c
# Opt level: O3

ggml_tensor *
ggml_view_2d(ggml_context *ctx,ggml_tensor *a,int ne0,int ne1,size_t nb1,size_t offset)

{
  int *piVar1;
  undefined1 auVar2 [32];
  undefined4 extraout_EAX;
  ggml_tensor *pgVar3;
  ggml_tensor *pgVar4;
  ggml_tensor *pgVar5;
  ggml_tensor *extraout_RAX;
  uint uVar6;
  undefined4 in_register_0000000c;
  uint extraout_EDX;
  int32_t value;
  int extraout_EDX_00;
  ggml_tensor *extraout_RDX;
  ggml_tensor *extraout_RDX_00;
  ggml_tensor *extraout_RDX_01;
  ggml_tensor *extraout_RDX_02;
  ggml_tensor *extraout_RDX_03;
  ggml_tensor *unaff_RBX;
  uint uVar7;
  uint uVar8;
  ulong unaff_R12;
  ggml_tensor *unaff_R14;
  int ne [4];
  int iStack_148;
  int iStack_144;
  undefined8 uStack_140;
  ggml_tensor *pgStack_130;
  ggml_tensor *pgStack_128;
  ggml_type gStack_120;
  int iStack_11c;
  undefined8 uStack_118;
  ggml_tensor *pgStack_108;
  ggml_tensor *pgStack_100;
  undefined4 uStack_f8;
  int iStack_f4;
  ggml_tensor *pgStack_f0;
  ulong uStack_e8;
  ggml_type gStack_90;
  int iStack_8c;
  ggml_tensor *pgStack_88;
  ggml_tensor *pgStack_80;
  ggml_tensor *pgStack_78;
  undefined1 auStack_70 [16];
  undefined8 uStack_60;
  undefined8 uStack_58;
  int local_28;
  int local_24;
  undefined8 local_20;
  
  pgVar3 = (ggml_tensor *)CONCAT44(in_register_0000000c,ne1);
  if (a->grad == (ggml_tensor *)0x0) {
    local_20 = 0x100000001;
    local_28 = ne0;
    local_24 = ne1;
    pgVar3 = ggml_new_tensor_impl(ctx,a->type,2,&local_28,(void *)(offset + (long)a->data));
    pgVar3->nb[1] = nb1;
    pgVar3->nb[2] = (long)ne1 * nb1;
    pgVar3->nb[3] = (long)ne1 * nb1;
    pgVar3->op = GGML_OP_VIEW;
    pgVar3->grad = (ggml_tensor *)0x0;
    pgVar3->src0 = a;
    pgVar3->src1 = (ggml_tensor *)0x0;
    return pgVar3;
  }
  ggml_view_2d_cold_1();
  if (extraout_EDX < 4) {
    uVar6 = (uint)pgVar3;
    if (3 < uVar6) goto LAB_00125ecb;
    uVar7 = (uint)nb1;
    unaff_R14 = (ggml_tensor *)(nb1 & 0xffffffff);
    if (3 < uVar7) goto LAB_00125ed0;
    uVar8 = (uint)offset;
    if (3 < uVar8) goto LAB_00125ed5;
    unaff_R12 = (ulong)extraout_EDX;
    if (extraout_EDX == uVar6) goto LAB_00125eda;
    if (extraout_EDX == uVar7) goto LAB_00125edf;
    if (extraout_EDX == uVar8) goto LAB_00125ee4;
    if (uVar6 == uVar7) goto LAB_00125ee9;
    if (uVar6 == uVar8) goto LAB_00125eee;
    if (uVar7 == uVar8) goto LAB_00125ef3;
    unaff_RBX = a;
    if (a->grad == (ggml_tensor *)0x0) {
      pgStack_78 = (ggml_tensor *)0x125e49;
      pgVar4 = ggml_new_tensor_impl(ctx,a->type,a->n_dims,a->ne,a->data);
      *(int *)((long)&uStack_60 + unaff_R12 * 4) = a->ne[0];
      *(int *)((long)&uStack_60 + ((ulong)pgVar3 & 0xffffffff) * 4) = a->ne[1];
      *(int *)((long)&uStack_60 + (nb1 & 0xffffffff) * 4) = a->ne[2];
      *(int *)((long)&uStack_60 + (offset & 0xffffffff) * 4) = a->ne[3];
      *(int *)(auStack_70 + unaff_R12 * 4) = (int)a->nb[0];
      *(int *)(auStack_70 + ((ulong)pgVar3 & 0xffffffff) * 4) = (int)a->nb[1];
      *(int *)(auStack_70 + (nb1 & 0xffffffff) * 4) = (int)a->nb[2];
      *(int *)(auStack_70 + (offset & 0xffffffff) * 4) = (int)a->nb[3];
      *(undefined8 *)pgVar4->ne = uStack_60;
      *(undefined8 *)(pgVar4->ne + 2) = uStack_58;
      auVar2 = vpmovsxdq_avx2(auStack_70);
      *(undefined1 (*) [32])pgVar4->nb = auVar2;
      pgVar4->op = GGML_OP_PERMUTE;
      pgVar4->grad = (ggml_tensor *)0x0;
      pgVar4->src0 = a;
      pgVar4->src1 = (ggml_tensor *)0x0;
      return pgVar4;
    }
  }
  else {
    pgStack_78 = (ggml_tensor *)0x125ecb;
    ggml_permute_cold_1();
LAB_00125ecb:
    pgStack_78 = (ggml_tensor *)0x125ed0;
    ggml_permute_cold_2();
LAB_00125ed0:
    pgStack_78 = (ggml_tensor *)0x125ed5;
    ggml_permute_cold_3();
LAB_00125ed5:
    pgStack_78 = (ggml_tensor *)0x125eda;
    ggml_permute_cold_4();
LAB_00125eda:
    pgStack_78 = (ggml_tensor *)0x125edf;
    ggml_permute_cold_11();
LAB_00125edf:
    pgStack_78 = (ggml_tensor *)0x125ee4;
    ggml_permute_cold_10();
LAB_00125ee4:
    pgStack_78 = (ggml_tensor *)0x125ee9;
    ggml_permute_cold_9();
LAB_00125ee9:
    pgStack_78 = (ggml_tensor *)0x125eee;
    ggml_permute_cold_8();
LAB_00125eee:
    pgStack_78 = (ggml_tensor *)0x125ef3;
    ggml_permute_cold_7();
LAB_00125ef3:
    pgStack_78 = (ggml_tensor *)0x125ef8;
    ggml_permute_cold_6();
  }
  pgStack_78 = (ggml_tensor *)ggml_transpose;
  ggml_permute_cold_5();
  pgStack_78 = unaff_RBX;
  if (a->grad == (ggml_tensor *)0x0) {
    pgStack_80 = (ggml_tensor *)0x125f1d;
    pgVar3 = ggml_new_tensor_impl(ctx,a->type,a->n_dims,a->ne,a->data);
    pgVar3->ne[0] = a->ne[1];
    pgVar3->ne[1] = a->ne[0];
    pgVar3->nb[0] = a->nb[1];
    pgVar3->nb[1] = a->nb[0];
    pgVar3->op = GGML_OP_TRANSPOSE;
    pgVar3->grad = (ggml_tensor *)0x0;
    pgVar3->src0 = a;
    pgVar3->src1 = (ggml_tensor *)0x0;
    return pgVar3;
  }
  pgStack_80 = (ggml_tensor *)ggml_get_rows;
  ggml_transpose_cold_1();
  pgVar4 = unaff_RBX;
  pgVar5 = unaff_R14;
  pgStack_88 = unaff_RBX;
  pgStack_80 = unaff_R14;
  if ((((a->ne[2] == 1) && (pgVar5 = a, a->ne[3] == 1)) &&
      (pgVar4 = extraout_RDX, extraout_RDX->ne[1] == 1)) &&
     (((extraout_RDX->ne[2] == 1 && (extraout_RDX->ne[3] == 1)) &&
      (extraout_RDX->type == GGML_TYPE_I32)))) {
    if ((a->grad == (ggml_tensor *)0x0) && (extraout_RDX->grad == (ggml_tensor *)0x0)) {
      _gStack_90 = CONCAT44(extraout_RDX->ne[0],a->ne[0]);
      pgVar3 = ggml_new_tensor_impl(ctx,GGML_TYPE_F32,2,(int *)&gStack_90,(void *)0x0);
      pgVar3->op = GGML_OP_GET_ROWS;
      pgVar3->grad = (ggml_tensor *)0x0;
      pgVar3->src0 = a;
      pgVar3->src1 = extraout_RDX;
      return pgVar3;
    }
  }
  else {
    ggml_get_rows_cold_1();
  }
  ggml_get_rows_cold_2();
  if (a->grad == (ggml_tensor *)0x0) {
    pgVar3 = ggml_new_tensor_impl(ctx,a->type,a->n_dims,a->ne,a->data);
    pgVar4 = ggml_new_i32(ctx,value);
    pgVar3->op = GGML_OP_DIAG_MASK_INF;
    pgVar3->grad = (ggml_tensor *)0x0;
    pgVar3->src0 = a;
    pgVar3->src1 = pgVar4;
    return pgVar3;
  }
  ggml_diag_mask_inf_cold_1();
  if (a->grad == (ggml_tensor *)0x0) {
    pgVar3 = ggml_new_tensor_impl(ctx,a->type,a->n_dims,a->ne,a->data);
    pgVar3->op = GGML_OP_SOFT_MAX;
    pgVar3->grad = (ggml_tensor *)0x0;
    pgVar3->src0 = a;
    pgVar3->src1 = (ggml_tensor *)0x0;
    return pgVar3;
  }
  ggml_soft_max_cold_1();
  pgStack_f0 = pgVar4;
  uStack_e8 = unaff_R12;
  if (extraout_EDX_00 < 0) {
    pgStack_100 = (ggml_tensor *)0x12611e;
    ggml_rope_cold_1();
    pgStack_108 = pgVar4;
  }
  else {
    pgStack_108 = a;
    if (a->grad == (ggml_tensor *)0x0) {
      pgStack_100 = (ggml_tensor *)0x1260bb;
      uStack_f8 = extraout_EAX;
      pgVar4 = ggml_new_tensor_impl(ctx,a->type,a->n_dims,a->ne,a->data);
      _uStack_f8 = CONCAT44(3,uStack_f8);
      pgStack_100 = (ggml_tensor *)0x1260de;
      pgVar5 = ggml_new_tensor_impl(ctx,GGML_TYPE_I32,1,&iStack_f4,(void *)0x0);
      piVar1 = (int *)pgVar5->data;
      *piVar1 = extraout_EDX_00;
      piVar1[1] = (int)pgVar3;
      piVar1[2] = (int)nb1;
      pgVar4->op = GGML_OP_ROPE;
      pgVar4->grad = (ggml_tensor *)0x0;
      pgVar4->src0 = a;
      pgVar4->src1 = pgVar5;
      return pgVar4;
    }
  }
  pgStack_100 = (ggml_tensor *)ggml_conv_1d_1s;
  ggml_rope_cold_2();
  pgVar4 = pgStack_108;
  pgStack_100 = pgVar5;
  if ((extraout_RDX_00->ne[2] == 1) && (pgVar4 = extraout_RDX_00, extraout_RDX_00->ne[3] == 1)) {
    pgVar5 = a;
    if (a->ne[1] != extraout_RDX_00->ne[1]) goto LAB_001261b1;
    if (a->ne[3] == 1) {
      if ((a->grad == (ggml_tensor *)0x0) && (extraout_RDX_00->grad == (ggml_tensor *)0x0)) {
        gStack_120 = extraout_RDX_00->ne[0];
        iStack_11c = a->ne[2];
        uStack_118 = 0x100000001;
        pgStack_128 = (ggml_tensor *)0x126188;
        pgVar3 = ggml_new_tensor_impl(ctx,GGML_TYPE_F32,2,(int *)&gStack_120,(void *)0x0);
        pgVar3->op = GGML_OP_CONV_1D_1S;
        pgVar3->grad = (ggml_tensor *)0x0;
        pgVar3->src0 = a;
        pgVar3->src1 = extraout_RDX_00;
        return pgVar3;
      }
      goto LAB_001261ac;
    }
  }
  else {
    pgStack_128 = (ggml_tensor *)0x1261ac;
    ggml_conv_1d_1s_cold_1();
LAB_001261ac:
    pgStack_128 = (ggml_tensor *)0x1261b1;
    ggml_conv_1d_1s_cold_4();
LAB_001261b1:
    pgStack_128 = (ggml_tensor *)0x1261b6;
    ggml_conv_1d_1s_cold_2();
  }
  pgStack_128 = (ggml_tensor *)ggml_conv_1d_2s;
  ggml_conv_1d_1s_cold_3();
  pgStack_130 = pgVar4;
  pgStack_128 = pgVar5;
  if ((extraout_RDX_01->ne[2] == 1) && (extraout_RDX_01->ne[3] == 1)) {
    if (a->ne[1] == extraout_RDX_01->ne[1]) {
      if (a->ne[3] != 1) goto LAB_0012625b;
      if ((a->grad == (ggml_tensor *)0x0) && (extraout_RDX_01->grad == (ggml_tensor *)0x0)) {
        iStack_148 = extraout_RDX_01->ne[0] / 2;
        iStack_144 = a->ne[2];
        uStack_140 = 0x100000001;
        pgVar3 = ggml_new_tensor_impl(ctx,GGML_TYPE_F32,2,&iStack_148,(void *)0x0);
        pgVar3->op = GGML_OP_CONV_1D_2S;
        pgVar3->grad = (ggml_tensor *)0x0;
        pgVar3->src0 = a;
        pgVar3->src1 = extraout_RDX_01;
        return pgVar3;
      }
      goto LAB_00126251;
    }
  }
  else {
    ggml_conv_1d_2s_cold_1();
LAB_00126251:
    ggml_conv_1d_2s_cold_4();
  }
  ggml_conv_1d_2s_cold_2();
LAB_0012625b:
  ggml_conv_1d_2s_cold_3();
  if (((extraout_RDX_02->ne[0] == a->ne[0]) && (extraout_RDX_02->ne[2] == a->ne[2])) &&
     (extraout_RDX_02->ne[3] == a->ne[3])) {
    if (((a->grad == (ggml_tensor *)0x0) && (extraout_RDX_02->grad == (ggml_tensor *)0x0)) &&
       (pgVar3->grad == (ggml_tensor *)0x0)) {
      pgVar4 = ggml_new_tensor_impl(ctx,GGML_TYPE_F32,4,a->ne,(void *)0x0);
      pgVar4->op = GGML_OP_FLASH_ATTN;
      pgVar4->grad = (ggml_tensor *)0x0;
      pgVar4->src0 = a;
      pgVar4->src1 = extraout_RDX_02;
      pgVar4->opt[0] = pgVar3;
      pgVar3 = ggml_new_i32(ctx,(uint)nb1 & 0xff);
      pgVar4->opt[1] = pgVar3;
      return pgVar4;
    }
  }
  else {
    ggml_flash_attn_cold_1();
  }
  ggml_flash_attn_cold_2();
  if (((extraout_RDX_03->ne[0] == a->ne[0]) && (extraout_RDX_03->ne[2] == a->ne[2])) &&
     (extraout_RDX_03->ne[3] == a->ne[3])) {
    if ((((a->grad == (ggml_tensor *)0x0) && (extraout_RDX_03->grad == (ggml_tensor *)0x0)) &&
        (pgVar3->grad == (ggml_tensor *)0x0)) &&
       ((((ggml_tensor *)nb1)->grad == (ggml_tensor *)0x0 &&
        (((ggml_tensor *)offset)->grad == (ggml_tensor *)0x0)))) {
      pgVar4 = ggml_new_tensor_impl(ctx,GGML_TYPE_F32,4,a->ne,(void *)0x0);
      pgVar4->op = GGML_OP_FLASH_FF;
      pgVar4->grad = (ggml_tensor *)0x0;
      pgVar4->src0 = a;
      pgVar4->src1 = extraout_RDX_03;
      pgVar4->opt[0] = pgVar3;
      pgVar4->opt[1] = (ggml_tensor *)nb1;
      pgVar4->opt[2] = (ggml_tensor *)offset;
      return pgVar4;
    }
    ggml_flash_ff_cold_2();
  }
  ggml_flash_ff_cold_1();
  a->is_param = true;
  if (a->grad == (ggml_tensor *)0x0) {
    pgVar3 = ggml_new_tensor_impl(ctx,a->type,a->n_dims,a->ne,(void *)0x0);
    a->grad = pgVar3;
    return pgVar3;
  }
  ggml_set_param_cold_1();
  ggml_build_forward_impl((ggml_cgraph *)ctx,a,true);
  return extraout_RAX;
}

Assistant:

struct ggml_tensor * ggml_view_2d(
        struct ggml_context * ctx,
        struct ggml_tensor  * a,
        int                   ne0,
        int                   ne1,
        size_t                nb1,
        size_t                offset) {
    if (a->grad) {
        GGML_ASSERT(false); // gradient propagation is not supported
    }

    const int ne[GGML_MAX_DIMS] = { ne0, ne1, 1, 1 };

    struct ggml_tensor * result = ggml_new_tensor_impl(ctx, a->type, 2, ne, (char *) a->data + offset);

    result->nb[1] = nb1;
    result->nb[2] = result->nb[1]*ne1;
    result->nb[3] = result->nb[2];

    result->op   = GGML_OP_VIEW;
    result->grad = NULL;
    result->src0 = a;
    result->src1 = NULL; // TODO: maybe store the offset here?

    return result;
}